

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O0

void transmaskwallscan(int x1,int x2,short *uwal,short *dwal,float *swal,fixed_t *lwal,
                      double yrepeat,_func_BYTE_ptr_FTexture_ptr_int *getcol)

{
  BYTE *pBVar1;
  fixed_t fVar2;
  bool bVar3;
  int bits;
  DWORD DVar4;
  fixed_t fVar5;
  int iVar6;
  int iVar7;
  int b;
  BYTE *pBVar8;
  bool bVar9;
  double dVar10;
  BYTE *i;
  bool fixed;
  fixed_t centeryfrac;
  double iscale;
  BYTE *basecolormapdata;
  SDWORD xoffset;
  float light;
  int iStack_88;
  char bad;
  int z;
  int dax;
  int startx;
  int d4;
  int u4;
  int y2ve [4];
  int y1ve [4];
  BYTE *p;
  int fracbits;
  int x;
  _func_void *tmvline4;
  _func_fixed_t *tmvline1;
  double yrepeat_local;
  fixed_t *lwal_local;
  float *swal_local;
  short *dwal_local;
  short *uwal_local;
  int x2_local;
  int x1_local;
  
  basecolormapdata._4_4_ = rw_light - rw_lightstep;
  if (rw_pic->UseType != '\r') {
    tmvline1 = (_func_fixed_t *)yrepeat;
    yrepeat_local = (double)lwal;
    lwal_local = (fixed_t *)swal;
    swal_local = (float *)dwal;
    dwal_local = uwal;
    uwal_local._0_4_ = x2;
    uwal_local._4_4_ = x1;
    bVar3 = R_GetTransMaskDrawers((_func_fixed_t **)&tmvline4,(_func_void **)&fracbits);
    if (bVar3) {
      FTexture::GetHeight(rw_pic);
      bits = 0x20 - (uint)rw_pic->HeightBits;
      setuptmvline(bits);
      fVar2 = rw_offset;
      pBVar1 = basecolormap->Maps;
      FloatToFixed(CenterY);
      p._4_4_ = uwal_local._4_4_;
      y1ve._8_8_ = dc_destorg + uwal_local._4_4_;
      bVar3 = fixedcolormap != (lighttable_t *)0x0;
      bVar9 = -1 < fixedlightlev;
      if (bVar3 || bVar9) {
        palookupoffse[0] = dc_colormap;
        palookupoffse[1] = dc_colormap;
        palookupoffse[2] = dc_colormap;
        palookupoffse[3] = dc_colormap;
      }
      for (; iVar6 = wallshade, p._4_4_ < (int)uwal_local && (y1ve._8_8_ & 3) != 0;
          p._4_4_ = p._4_4_ + 1) {
        basecolormapdata._4_4_ = rw_lightstep + basecolormapdata._4_4_;
        y2ve[2] = (int)dwal_local[p._4_4_];
        d4 = (int)*(short *)((long)swal_local + (long)p._4_4_ * 2);
        if (dwal_local[p._4_4_] < d4) {
          if (!bVar3 && !bVar9) {
            dVar10 = MIN<double>(24.0,(double)basecolormapdata._4_4_);
            fVar5 = FloatToFixed(dVar10);
            iVar6 = clamp<int>(iVar6 - fVar5 >> 0x10,0,0x1f);
            dc_colormap = pBVar1 + (iVar6 << 8);
          }
          dc_source = (*getcol)(rw_pic,*(int *)((long)yrepeat_local + (long)p._4_4_ * 4) + fVar2 >>
                                       0x10);
          dc_dest = (BYTE *)(y1ve._8_8_ + (long)ylookup[y2ve[2]]);
          dc_count = d4 - y2ve[2];
          dVar10 = (double)(float)lwal_local[p._4_4_] * (double)tmvline1;
          dc_iscale = xs_ToFixed(bits,(real64)dVar10);
          dc_texturefrac =
               xs_ToFixed(bits,(real64)(dc_texturemid + dVar10 * (((double)y2ve[2] - CenterY) + 0.5)
                                       ));
          (*tmvline4)();
        }
        y1ve._8_8_ = y1ve._8_8_ + 1;
      }
      for (; p._4_4_ < (int)uwal_local + -3; p._4_4_ = p._4_4_ + 4) {
        xoffset._3_1_ = 0;
        iStack_88 = p._4_4_ + 3;
        for (light = 4.2039e-45; -1 < (int)light; light = (float)((int)light + -1)) {
          y2ve[(long)(int)light + 2] = (int)dwal_local[iStack_88];
          (&d4)[(int)light] = (int)*(short *)((long)swal_local + (long)iStack_88 * 2);
          if (y2ve[(long)(int)light + 2] < (&d4)[(int)light]) {
            pBVar8 = (*getcol)(rw_pic,*(int *)((long)yrepeat_local + (long)iStack_88 * 4) + fVar2 >>
                                      0x10);
            bufplce[(int)light] = pBVar8;
            DVar4 = xs_ToFixed(bits,(real64)((double)(float)lwal_local[iStack_88] * (double)tmvline1
                                            ));
            vince[(int)light] = DVar4;
            DVar4 = xs_ToFixed(bits,(real64)(dc_texturemid +
                                            (double)vince[(int)light] *
                                            (((double)y2ve[(long)(int)light + 2] - CenterY) + 0.5)))
            ;
            vplce[(int)light] = DVar4;
          }
          else {
            xoffset._3_1_ = xoffset._3_1_ + (char)(1 << (SUB41(light,0) & 0x1f));
          }
          iStack_88 = iStack_88 + -1;
        }
        if (xoffset._3_1_ == 0xf) {
          basecolormapdata._4_4_ = rw_lightstep * 4.0 + basecolormapdata._4_4_;
        }
        else {
          if (!bVar3 && !bVar9) {
            for (light = 0.0; iVar6 = wallshade, (int)light < 4; light = (float)((int)light + 1)) {
              basecolormapdata._4_4_ = rw_lightstep + basecolormapdata._4_4_;
              dVar10 = MIN<double>(24.0,(double)basecolormapdata._4_4_);
              fVar5 = FloatToFixed(dVar10);
              iVar6 = clamp<int>(iVar6 - fVar5 >> 0x10,0,0x1f);
              palookupoffse[(int)light] = pBVar1 + (iVar6 << 8);
            }
          }
          iVar6 = MAX<int>(y2ve[2],y2ve[3]);
          iVar7 = MAX<int>(y1ve[0],y1ve[1]);
          iVar6 = MAX<int>(iVar6,iVar7);
          iVar7 = MIN<int>(d4,u4);
          b = MIN<int>(y2ve[0],y2ve[1]);
          iVar7 = MIN<int>(iVar7,b);
          if ((xoffset._3_1_ == 0) && (iVar6 < iVar7)) {
            for (light = 0.0; (int)light < 4; light = (float)((int)light + 1)) {
              if (y2ve[(long)(int)light + 2] < iVar6) {
                preptmvline1(vince[(int)light],palookupoffse[(int)light],
                             iVar6 - y2ve[(long)(int)light + 2],vplce[(int)light],
                             bufplce[(int)light],
                             (BYTE *)(y1ve._8_8_ + (long)ylookup[y2ve[(long)(int)light + 2]] +
                                     (long)(int)light));
                DVar4 = (*tmvline4)();
                vplce[(int)light] = DVar4;
              }
            }
            if (iVar6 < iVar7) {
              dc_count = iVar7 - iVar6;
              dc_dest = (BYTE *)(y1ve._8_8_ + (long)ylookup[iVar6]);
              (*_fracbits)();
            }
            iVar6 = ylookup[iVar7];
            for (light = 0.0; (int)light < 4; light = (float)((int)light + 1)) {
              if (iVar7 < (&d4)[(int)light]) {
                preptmvline1(vince[(int)light],palookupoffse[0],(&d4)[(int)light] - iVar7,
                             vplce[(int)light],bufplce[(int)light],
                             (BYTE *)(y1ve._8_8_ + (long)iVar6 + (long)(int)light));
                (*tmvline4)();
              }
            }
          }
          else {
            for (light = 0.0; (int)light < 4; light = (float)((int)light + 1)) {
              if ((xoffset._3_1_ & 1) == 0) {
                preptmvline1(vince[(int)light],palookupoffse[(int)light],
                             (&d4)[(int)light] - y2ve[(long)(int)light + 2],vplce[(int)light],
                             bufplce[(int)light],
                             (BYTE *)(y1ve._8_8_ + (long)ylookup[y2ve[(long)(int)light + 2]] +
                                     (long)(int)light));
                (*tmvline4)();
              }
              xoffset._3_1_ = (char)xoffset._3_1_ >> 1;
            }
          }
        }
        y1ve._8_8_ = y1ve._8_8_ + 4;
      }
      for (; iVar6 = wallshade, p._4_4_ < (int)uwal_local; p._4_4_ = p._4_4_ + 1) {
        basecolormapdata._4_4_ = rw_lightstep + basecolormapdata._4_4_;
        y2ve[2] = (int)dwal_local[p._4_4_];
        d4 = (int)*(short *)((long)swal_local + (long)p._4_4_ * 2);
        if (y2ve[2] < d4) {
          if (!bVar3 && !bVar9) {
            dVar10 = MIN<double>(24.0,(double)basecolormapdata._4_4_);
            fVar5 = FloatToFixed(dVar10);
            iVar6 = clamp<int>(iVar6 - fVar5 >> 0x10,0,0x1f);
            dc_colormap = pBVar1 + (iVar6 << 8);
          }
          dc_source = (*getcol)(rw_pic,*(int *)((long)yrepeat_local + (long)p._4_4_ * 4) + fVar2 >>
                                       0x10);
          dc_dest = (BYTE *)(y1ve._8_8_ + (long)ylookup[y2ve[2]]);
          dc_count = d4 - y2ve[2];
          dVar10 = (double)(float)lwal_local[p._4_4_] * (double)tmvline1;
          dc_iscale = xs_ToFixed(bits,(real64)dVar10);
          dc_texturefrac =
               xs_ToFixed(bits,(real64)(dc_texturemid + dVar10 * (((double)y2ve[2] - CenterY) + 0.5)
                                       ));
          (*tmvline4)();
        }
        y1ve._8_8_ = y1ve._8_8_ + 1;
      }
      NetUpdate();
    }
    else {
      maskwallscan(uwal_local._4_4_,(int)uwal_local,dwal_local,(short *)swal_local,
                   (float *)lwal_local,(fixed_t *)yrepeat_local,(double)tmvline1,getcol);
    }
  }
  return;
}

Assistant:

void transmaskwallscan (int x1, int x2, short *uwal, short *dwal, float *swal, fixed_t *lwal,
	double yrepeat, const BYTE *(*getcol)(FTexture *tex, int x))
{
	fixed_t (*tmvline1)();
	void (*tmvline4)();
	int x, fracbits;
	BYTE *p;
	int y1ve[4], y2ve[4], u4, d4, startx, dax, z;
	char bad;
	float light = rw_light - rw_lightstep;
	SDWORD xoffset;
	BYTE *basecolormapdata;
	double iscale;

	if (rw_pic->UseType == FTexture::TEX_Null)
	{
		return;
	}

	if (!R_GetTransMaskDrawers (&tmvline1, &tmvline4))
	{
		// The current translucency is unsupported, so draw with regular maskwallscan instead.
		maskwallscan (x1, x2, uwal, dwal, swal, lwal, yrepeat, getcol);
		return;
	}

//extern cycle_t WallScanCycles;
//clock (WallScanCycles);

	rw_pic->GetHeight();	// Make sure texture size is loaded
	fracbits = 32 - rw_pic->HeightBits;
	setuptmvline(fracbits);
	xoffset = rw_offset;
	basecolormapdata = basecolormap->Maps;
	fixed_t centeryfrac = FLOAT2FIXED(CenterY);

	x = startx = x1;
	p = x + dc_destorg;

	bool fixed = (fixedcolormap != NULL || fixedlightlev >= 0);
	if (fixed)
	{
		palookupoffse[0] = dc_colormap;
		palookupoffse[1] = dc_colormap;
		palookupoffse[2] = dc_colormap;
		palookupoffse[3] = dc_colormap;
	}

	for(; (x < x2) && ((size_t)p & 3); ++x, ++p)
	{
		light += rw_lightstep;
		y1ve[0] = uwal[x];//max(uwal[x],umost[x]);
		y2ve[0] = dwal[x];//min(dwal[x],dmost[x]);
		if (y2ve[0] <= y1ve[0]) continue;

		if (!fixed)
		{ // calculate lighting
			dc_colormap = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
		}

		dc_source = getcol (rw_pic, (lwal[x] + xoffset) >> FRACBITS);
		dc_dest = ylookup[y1ve[0]] + p;
		dc_count = y2ve[0] - y1ve[0];
		iscale = swal[x] * yrepeat;
		dc_iscale = xs_ToFixed(fracbits, iscale);
		dc_texturefrac = xs_ToFixed(fracbits, dc_texturemid + iscale * (y1ve[0] - CenterY + 0.5));

		tmvline1();
	}

	for(; x < x2-3; x += 4, p+= 4)
	{
		bad = 0;
		for (z = 3, dax = x+3; z >= 0; --z, --dax)
		{
			y1ve[z] = uwal[dax];
			y2ve[z] = dwal[dax];
			if (y2ve[z] <= y1ve[z]) { bad += 1<<z; continue; }

			bufplce[z] = getcol (rw_pic, (lwal[dax] + xoffset) >> FRACBITS);
			iscale = swal[dax] * yrepeat;
			vince[z] = xs_ToFixed(fracbits, iscale);
			vplce[z] = xs_ToFixed(fracbits, dc_texturemid + vince[z] * (y1ve[z] - CenterY + 0.5));
		}
		if (bad == 15)
		{
			light += rw_lightstep * 4;
			continue;
		}

		if (!fixed)
		{
			for (z = 0; z < 4; ++z)
			{
				light += rw_lightstep;
				palookupoffse[z] = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
			}
		}

		u4 = MAX(MAX(y1ve[0],y1ve[1]),MAX(y1ve[2],y1ve[3]));
		d4 = MIN(MIN(y2ve[0],y2ve[1]),MIN(y2ve[2],y2ve[3]));

		if ((bad != 0) || (u4 >= d4))
		{
			for (z = 0; z < 4; ++z)
			{
				if (!(bad & 1))
				{
					preptmvline1(vince[z],palookupoffse[z],y2ve[z]-y1ve[z],vplce[z],bufplce[z],ylookup[y1ve[z]]+p+z);
					tmvline1();
				}
				bad >>= 1;
			}
			continue;
		}

		for (z = 0; z < 4; ++z)
		{
			if (u4 > y1ve[z])
			{
				preptmvline1(vince[z],palookupoffse[z],u4-y1ve[z],vplce[z],bufplce[z],ylookup[y1ve[z]]+p+z);
				vplce[z] = tmvline1();
			}
		}

		if (d4 > u4)
		{
			dc_count = d4-u4;
			dc_dest = ylookup[u4]+p;
			tmvline4();
		}

		BYTE *i = p+ylookup[d4];
		for (z = 0; z < 4; ++z)
		{
			if (y2ve[z] > d4)
			{
				preptmvline1(vince[z],palookupoffse[0],y2ve[z]-d4,vplce[z],bufplce[z],i+z);
				tmvline1();
			}
		}
	}
	for(; x < x2; ++x, ++p)
	{
		light += rw_lightstep;
		y1ve[0] = uwal[x];
		y2ve[0] = dwal[x];
		if (y2ve[0] <= y1ve[0]) continue;

		if (!fixed)
		{ // calculate lighting
			dc_colormap = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
		}

		dc_source = getcol (rw_pic, (lwal[x] + xoffset) >> FRACBITS);
		dc_dest = ylookup[y1ve[0]] + p;
		dc_count = y2ve[0] - y1ve[0];
		iscale = swal[x] * yrepeat;
		dc_iscale = xs_ToFixed(fracbits, iscale);
		dc_texturefrac = xs_ToFixed(fracbits, dc_texturemid + iscale * (y1ve[0] - CenterY + 0.5));

		tmvline1();
	}

//unclock(WallScanCycles);

	NetUpdate ();
}